

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BindApproxQuantile
          (duckdb *this,ClientContext *context,AggregateFunction *function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  Value *pVVar1;
  char cVar2;
  reference pvVar3;
  pointer pEVar4;
  type pEVar5;
  undefined8 *puVar6;
  ParameterNotResolvedException *this_00;
  BinderException *pBVar7;
  Value *element_val;
  Value *pVVar8;
  float local_a0;
  undefined4 uStack_9c;
  vector<float,_true> quantiles;
  Value quantile_val;
  char local_58;
  
  pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,1);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar3);
  cVar2 = (**(code **)(*(long *)pEVar4 + 0x30))(pEVar4);
  if (cVar2 != '\0') {
    this_00 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
    duckdb::ParameterNotResolvedException::ParameterNotResolvedException(this_00);
    __cxa_throw(this_00,&ParameterNotResolvedException::typeinfo,std::runtime_error::~runtime_error)
    ;
  }
  pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,1);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar3);
  cVar2 = (**(code **)(*(long *)pEVar4 + 0x78))(pEVar4);
  if (cVar2 != '\0') {
    pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,1);
    pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(pvVar3);
    duckdb::ExpressionExecutor::EvaluateScalar
              ((ClientContext *)&quantile_val,(Expression *)context,SUB81(pEVar5,0));
    if (local_58 != '\x01') {
      quantiles.super_vector<float,_std::allocator<float>_>.
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      quantiles.super_vector<float,_std::allocator<float>_>.
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      quantiles.super_vector<float,_std::allocator<float>_>.
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)0x0;
      if (quantile_val == (Value)0x65) {
        puVar6 = (undefined8 *)duckdb::ListValue::GetChildren(&quantile_val);
        pVVar1 = (Value *)puVar6[1];
        for (pVVar8 = (Value *)*puVar6; pVVar8 != pVVar1; pVVar8 = pVVar8 + 0x40) {
          local_a0 = CheckApproxQuantile(pVVar8);
          std::vector<float,_std::allocator<float>_>::emplace_back<float>
                    (&quantiles.super_vector<float,_std::allocator<float>_>,&local_a0);
        }
      }
      else if (quantile_val == (Value)0x6c) {
        puVar6 = (undefined8 *)duckdb::ArrayValue::GetChildren(&quantile_val);
        pVVar1 = (Value *)puVar6[1];
        for (pVVar8 = (Value *)*puVar6; pVVar8 != pVVar1; pVVar8 = pVVar8 + 0x40) {
          local_a0 = CheckApproxQuantile(pVVar8);
          std::vector<float,_std::allocator<float>_>::emplace_back<float>
                    (&quantiles.super_vector<float,_std::allocator<float>_>,&local_a0);
        }
      }
      else {
        local_a0 = CheckApproxQuantile(&quantile_val);
        std::vector<float,_std::allocator<float>_>::emplace_back<float>
                  (&quantiles.super_vector<float,_std::allocator<float>_>,&local_a0);
      }
      duckdb::Function::EraseArgument
                ((SimpleFunction *)function,(vector *)arguments,
                 ((long)(arguments->
                        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ).
                        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(arguments->
                        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ).
                        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) - 1);
      make_uniq<duckdb::ApproximateQuantileBindData,duckdb::vector<float,true>&>
                ((duckdb *)&local_a0,&quantiles);
      *(ulong *)this = CONCAT44(uStack_9c,local_a0);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)&quantiles);
      duckdb::Value::~Value(&quantile_val);
      return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
    }
    pBVar7 = (BinderException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&quantiles,"APPROXIMATE QUANTILE parameter list cannot be NULL",
               (allocator *)&local_a0);
    duckdb::BinderException::BinderException(pBVar7,(string *)&quantiles);
    __cxa_throw(pBVar7,&BinderException::typeinfo,std::runtime_error::~runtime_error);
  }
  pBVar7 = (BinderException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)&quantile_val,
             "APPROXIMATE QUANTILE can only take constant quantile parameters",
             (allocator *)&quantiles);
  duckdb::BinderException::BinderException(pBVar7,(string *)&quantile_val);
  __cxa_throw(pBVar7,&BinderException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<FunctionData> BindApproxQuantile(ClientContext &context, AggregateFunction &function,
                                            vector<unique_ptr<Expression>> &arguments) {
	if (arguments[1]->HasParameter()) {
		throw ParameterNotResolvedException();
	}
	if (!arguments[1]->IsFoldable()) {
		throw BinderException("APPROXIMATE QUANTILE can only take constant quantile parameters");
	}
	Value quantile_val = ExpressionExecutor::EvaluateScalar(context, *arguments[1]);
	if (quantile_val.IsNull()) {
		throw BinderException("APPROXIMATE QUANTILE parameter list cannot be NULL");
	}

	vector<float> quantiles;
	switch (quantile_val.type().id()) {
	case LogicalTypeId::LIST:
		for (const auto &element_val : ListValue::GetChildren(quantile_val)) {
			quantiles.push_back(CheckApproxQuantile(element_val));
		}
		break;
	case LogicalTypeId::ARRAY:
		for (const auto &element_val : ArrayValue::GetChildren(quantile_val)) {
			quantiles.push_back(CheckApproxQuantile(element_val));
		}
		break;
	default:
		quantiles.push_back(CheckApproxQuantile(quantile_val));
		break;
	}

	// remove the quantile argument so we can use the unary aggregate
	Function::EraseArgument(function, arguments, arguments.size() - 1);
	return make_uniq<ApproximateQuantileBindData>(quantiles);
}